

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# density_test_common.h
# Opt level: O0

density_tests * __thiscall
density_tests::
truncated_type_name<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
          (density_tests *this,size_t i_max_size)

{
  char *pcVar1;
  ulong uVar2;
  char *local_58;
  allocator local_2a;
  undefined1 local_29;
  char *local_28;
  char *demangled;
  size_t sStack_18;
  int status;
  size_t i_max_size_local;
  string *name;
  
  demangled._4_4_ = 0;
  sStack_18 = i_max_size;
  i_max_size_local = (size_t)this;
  pcVar1 = std::type_info::name
                     ((type_info *)
                      &density::
                       sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
                       ::typeinfo);
  local_58 = (char *)__cxa_demangle(pcVar1,0,0,(long)&demangled + 4);
  local_29 = 0;
  local_28 = local_58;
  if (demangled._4_4_ != 0) {
    local_58 = std::type_info::name
                         ((type_info *)
                          &density::
                           sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
                           ::typeinfo);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,local_58,&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  uVar2 = std::__cxx11::string::size();
  if (sStack_18 < uVar2) {
    std::__cxx11::string::resize((ulong)this);
  }
  free(local_28);
  return this;
}

Assistant:

std::string truncated_type_name(size_t i_max_size = 80)
    {
#if defined(__GNUC__) && !defined(_MSC_VER)
        int         status    = 0;
        auto const  demangled = abi::__cxa_demangle(typeid(TYPE).name(), 0, 0, &status);
        std::string name      = status == 0 ? demangled : typeid(TYPE).name();
#else
        std::string name = typeid(TYPE).name();
#endif

        if (name.size() > i_max_size)
            name.resize(i_max_size);

#if defined(__GNUC__) && !defined(_MSC_VER)
        free(demangled);
#endif
        return name;
    }